

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_page_operator.c
# Opt level: O3

HPDF_STATUS HPDF_Page_ShowText(HPDF_Page page,char *text)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  HPDF_PageAttr attr;
  HPDF_Point HVar5;
  HPDF_Point HVar6;
  HPDF_STATUS HVar7;
  HPDF_REAL HVar8;
  
  HVar7 = HPDF_Page_CheckState(page,4);
  if (text != (char *)0x0 && HVar7 == 0) {
    if (*text != '\0') {
      attr = (HPDF_PageAttr)page->attr;
      if (attr->gstate->font == (HPDF_Font)0x0) {
        HVar7 = HPDF_RaiseError(page->error,0x104e,0);
        return HVar7;
      }
      HVar8 = HPDF_Page_TextWidth(page,text);
      if ((HVar8 != 0.0) || (NAN(HVar8))) {
        HVar7 = InternalWriteText(attr,text);
        if (HVar7 != 0) {
LAB_0012c707:
          HVar7 = HPDF_CheckError(page->error);
          return HVar7;
        }
        HVar7 = HPDF_Stream_WriteStr(attr->stream," Tj\n");
        if (HVar7 != 0) goto LAB_0012c707;
        if (attr->gstate->writing_mode == HPDF_WMODE_HORIZONTAL) {
          uVar2 = (attr->text_matrix).a;
          uVar4 = (attr->text_matrix).b;
          HVar6.y = HVar8 * (float)uVar4 + (attr->text_pos).y;
          HVar6.x = HVar8 * (float)uVar2 + (attr->text_pos).x;
          attr->text_pos = HVar6;
        }
        else {
          uVar1 = (attr->text_matrix).a;
          uVar3 = (attr->text_matrix).b;
          HVar5.y = (attr->text_pos).y - HVar8 * (float)uVar1;
          HVar5.x = (attr->text_pos).x - HVar8 * (float)uVar3;
          attr->text_pos = HVar5;
        }
      }
    }
    HVar7 = 0;
  }
  return HVar7;
}

Assistant:

HPDF_EXPORT(HPDF_STATUS)
HPDF_Page_ShowText  (HPDF_Page    page,
                     const char  *text)
{
    HPDF_STATUS ret = HPDF_Page_CheckState (page, HPDF_GMODE_TEXT_OBJECT);
    HPDF_PageAttr attr;
    HPDF_REAL tw;

    HPDF_PTRACE ((" HPDF_Page_ShowText\n"));

    if (ret != HPDF_OK || text == NULL || text[0] == 0)
        return ret;

    attr = (HPDF_PageAttr)page->attr;

    /* no font exists */
    if (!attr->gstate->font)
        return HPDF_RaiseError (page->error, HPDF_PAGE_FONT_NOT_FOUND, 0);

    tw = HPDF_Page_TextWidth (page, text);
    if (!tw)
        return ret;

    if (InternalWriteText (attr, text) != HPDF_OK)
        return HPDF_CheckError (page->error);

    if (HPDF_Stream_WriteStr (attr->stream, " Tj\012") != HPDF_OK)
        return HPDF_CheckError (page->error);

    /* calculate the reference point of text */
    if (attr->gstate->writing_mode == HPDF_WMODE_HORIZONTAL) {
        attr->text_pos.x += tw * attr->text_matrix.a;
        attr->text_pos.y += tw * attr->text_matrix.b;
    } else {
        attr->text_pos.x -= tw * attr->text_matrix.b;
        attr->text_pos.y -= tw * attr->text_matrix.a;
    }

    return ret;
}